

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedatabase.cpp
# Opt level: O2

QStringList * __thiscall
QMimeDatabasePrivate::mimeTypeForFileName
          (QStringList *__return_storage_ptr__,QMimeDatabasePrivate *this,QString *fileName)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  initializer_list<QString> args;
  QMimeGlobMatchResult result;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QString::endsWith(fileName,(QChar)0x2f,CaseSensitive);
  if (bVar2) {
    directoryMimeType();
    args._M_len = 1;
    args._M_array = (iterator)&result;
    QList<QString>::QList(__return_storage_ptr__,args);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&result);
  }
  else {
    result.m_knownSuffixLength = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    result._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    result.m_matchingPatternLength = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    result.m_allMatchingMimeTypes.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    result.m_allMatchingMimeTypes.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    result.m_matchingMimeTypes.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    result.m_allMatchingMimeTypes.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    result.m_matchingMimeTypes.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    result.m_matchingMimeTypes.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    findByFileName(&result,this,fileName);
    (__return_storage_ptr__->d).d = result.m_matchingMimeTypes.d.d;
    (__return_storage_ptr__->d).ptr = result.m_matchingMimeTypes.d.ptr;
    (__return_storage_ptr__->d).size = result.m_matchingMimeTypes.d.size;
    if (result.m_matchingMimeTypes.d.d != (Data *)0x0) {
      LOCK();
      ((result.m_matchingMimeTypes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
      _M_i = ((result.m_matchingMimeTypes.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QtPrivate::QStringList_sort(__return_storage_ptr__,CaseSensitive);
    QMimeGlobMatchResult::~QMimeGlobMatchResult(&result);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QMimeDatabasePrivate::mimeTypeForFileName(const QString &fileName)
{
    if (fileName.endsWith(u'/'))
        return { directoryMimeType() };

    const QMimeGlobMatchResult result = findByFileName(fileName);
    QStringList matchingMimeTypes = result.m_matchingMimeTypes;
    matchingMimeTypes.sort(); // make it deterministic
    return matchingMimeTypes;
}